

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.cpp
# Opt level: O3

string * __thiscall
booster::aio::endpoint::ip_abi_cxx11_(string *__return_storage_ptr__,endpoint *this)

{
  family_type fVar1;
  char *__s;
  size_t sVar2;
  socklen_t __len;
  void *__cp;
  endpoint *this_00;
  char buf [17];
  char local_48 [16];
  ulong local_38;
  undefined7 uStack_30;
  undefined1 uStack_29;
  undefined7 uStack_28;
  undefined8 uStack_21;
  
  this_00 = this;
  fVar1 = family(this);
  if (fVar1 == pf_inet6) {
    uStack_28 = 0;
    uStack_21 = 0;
    local_38 = 0;
    uStack_30 = 0;
    uStack_29 = 0;
    __cp = (void *)((long)&((this->d).ptr_)->sa + 8);
    this_00 = (endpoint *)0xa;
    __len = 0x2f;
  }
  else {
    if (fVar1 != pf_inet) goto LAB_0015f74b;
    local_38 = local_38 & 0xffffffffffffff00;
    __cp = (void *)((long)&((this->d).ptr_)->sa + 4);
    this_00 = (endpoint *)0x2;
    __len = 0x11;
  }
  local_48[8] = '\0';
  local_48[9] = '\0';
  local_48[10] = '\0';
  local_48[0xb] = '\0';
  local_48[0xc] = '\0';
  local_48[0xd] = '\0';
  local_48[0xe] = '\0';
  local_48[0xf] = '\0';
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  __s = inet_ntop((int)this_00,__cp,local_48,__len);
  if (__s != (char *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar2 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,__s,__s + sVar2);
    return __return_storage_ptr__;
  }
LAB_0015f74b:
  throw_invalid(this_00);
}

Assistant:

std::string endpoint::ip() const
{
	switch(family()) {
	case pf_inet:
		{
#ifndef BOOSTER_WIN32
			char buf[INET_ADDRSTRLEN+1] = {0};
			char const *res = ::inet_ntop(AF_INET,&d->sa.in.sin_addr,buf,sizeof(buf));
			if(res)
				return std::string(res);
			throw_invalid();
#else
			std::ostringstream tmp;
			tmp.imbue(std::locale::classic());
			unsigned char const *p = reinterpret_cast<unsigned char const *>(&d->sa.in.sin_addr);
			tmp << int(p[0]) <<"." << int(p[1]) <<"."<<int(p[2]) <<"." << int(p[3]);
			return tmp.str();
#endif
		}
		break;
#ifndef BOOSTER_AIO_NO_PF_INET6
	case pf_inet6:
		{
			char buf[INET6_ADDRSTRLEN+1] = {0};
            #ifndef BOOSTER_WIN32
			char const *res = ::inet_ntop(AF_INET6,&d->sa.in6.sin6_addr,buf,sizeof(buf));
            #else
            struct in6_addr addr = d->sa.in6.sin6_addr; 
            // under windows it isn't const function
            char const *res = ::inet_ntop(AF_INET6,&addr,buf,sizeof(buf));
            #endif
			if(res)
				return std::string(res);
			throw_invalid();
		}
		break;
#endif
	default:
		throw_invalid();
	}
	return std::string(); // shut gcc up
}